

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QTextHtmlParser::ExternalStyleSheet>::moveAppend
          (QGenericArrayOps<QTextHtmlParser::ExternalStyleSheet> *this,ExternalStyleSheet *b,
          ExternalStyleSheet *e)

{
  ExternalStyleSheet *this_00;
  ulong in_RDX;
  ulong in_RSI;
  ExternalStyleSheet *in_RDI;
  ExternalStyleSheet *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet>::begin
                        ((QArrayDataPointer<QTextHtmlParser::ExternalStyleSheet> *)0x86d8d7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QTextHtmlParser::ExternalStyleSheet::ExternalStyleSheet(this_00,in_RDI);
      local_10 = local_10 + 0xb8;
      (in_RDI->url).d.size = (in_RDI->url).d.size + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }